

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha512_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA512_CTX context;
  SHA512_CTX local_f8;
  
  local_f8.state[6] = 0x1f83d9abfb41bd6b;
  local_f8.state[7] = 0x5be0cd19137e2179;
  local_f8.state[4] = 0x510e527fade682d1;
  local_f8.state[5] = 0x9b05688c2b3e6c1f;
  local_f8.state[2] = 0x3c6ef372fe94f82b;
  local_f8.state[3] = 0xa54ff53a5f1d36f1;
  local_f8.state[0] = 0x6a09e667f3bcc908;
  local_f8.state[1] = 0xbb67ae8584caa73b;
  memzero(local_f8.buffer,0x80);
  local_f8.bitcount[0] = 0;
  local_f8.bitcount[1] = 0;
  sha512_Update(&local_f8,data,len);
  sha512_Final(&local_f8,digest);
  return;
}

Assistant:

void sha512_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA512_DIGEST_LENGTH]) {
    trezor::SHA512_CTX	context;
	sha512_Init(&context);
	sha512_Update(&context, data, len);
	sha512_Final(&context, digest);
}